

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Diligent::ShaderVkImpl::GetSPIRV(ShaderVkImpl *this)

{
  bool bVar1;
  int iVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  ShaderVkImpl *this_local;
  
  if (GetSPIRV()::NullSPIRV == '\0') {
    iVar2 = __cxa_guard_acquire(&GetSPIRV()::NullSPIRV);
    if (iVar2 != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&GetSPIRV::NullSPIRV);
      __cxa_atexit(std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector,
                   &GetSPIRV::NullSPIRV,&__dso_handle);
      __cxa_guard_release(&GetSPIRV()::NullSPIRV);
    }
  }
  bVar1 = ShaderBase<Diligent::EngineVkImplTraits>::IsCompiling
                    (&this->super_ShaderBase<Diligent::EngineVkImplTraits>);
  if (bVar1) {
    local_20 = &GetSPIRV::NullSPIRV;
  }
  else {
    local_20 = &this->m_SPIRV;
  }
  return local_20;
}

Assistant:

GetSPIRV() const override final
    {
        static const std::vector<uint32_t> NullSPIRV;
        // NOTE: while shader is compiled asynchronously, m_SPIRV may be modified by
        //       another thread and thus can't be accessed.
        return !IsCompiling() ? m_SPIRV : NullSPIRV;
    }